

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O1

Tuple4d * math::reflect(Tuple4d *in,Tuple4d *normal)

{
  Tuple4d *ret_2;
  int i;
  long lVar1;
  double total;
  double dVar2;
  Tuple4d ret;
  Tuple4d ret_1;
  
  ret.m_buffer[2] = 0.0;
  ret.m_buffer[3] = 0.0;
  ret.m_buffer[0] = 0.0;
  ret.m_buffer[1] = 0.0;
  lVar1 = 0;
  do {
    ret.m_buffer[lVar1] = normal->m_buffer[lVar1] + normal->m_buffer[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + in->m_buffer[lVar1] * normal->m_buffer[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  ret_1.m_buffer[2] = 0.0;
  ret_1.m_buffer[3] = 0.0;
  ret_1.m_buffer[0] = 0.0;
  ret_1.m_buffer[1] = 0.0;
  lVar1 = 0;
  do {
    ret_1.m_buffer[lVar1] = ret.m_buffer[lVar1] * dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  ret_2->m_buffer[2] = 0.0;
  ret_2->m_buffer[3] = 0.0;
  ret_2->m_buffer[0] = 0.0;
  ret_2->m_buffer[1] = 0.0;
  lVar1 = 0;
  do {
    ret_2->m_buffer[lVar1] = in->m_buffer[lVar1] - ret_1.m_buffer[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return ret_2;
}

Assistant:

math::Tuple4d math::reflect(const math::Tuple4d &in, const math::Tuple4d &normal)
{
    return in - normal * 2 * dot(in, normal);
}